

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrameUpdateHoveredWindowAndCaptureFlags(void)

{
  ImVector<ImGuiWindow_*> *this;
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  uint uVar5;
  ImGuiIO *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  value_type *ppIVar9;
  ImGuiWindow *potential_parent;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  ulong uVar13;
  int iVar14;
  byte bVar15;
  ulong uVar16;
  ImGuiContext *g;
  ImGuiWindow *pIVar17;
  ImGuiWindow *window;
  ImRect local_40;
  
  pIVar7 = GImGui;
  pIVar17 = GImGui->MovingWindow;
  if ((pIVar17 == (ImGuiWindow *)0x0) || ((pIVar17->Flags & 0x200) != 0)) {
    this = &GImGui->Windows;
    iVar14 = (GImGui->Windows).Size;
    pIVar6 = &GImGui->IO;
    do {
      do {
        if (iVar14 < 1) {
          pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
          pIVar17 = (ImGuiWindow *)0x0;
          window = (ImGuiWindow *)0x0;
          goto LAB_00155fb6;
        }
        iVar14 = iVar14 + -1;
        ppIVar9 = ImVector<ImGuiWindow_*>::operator[](this,iVar14);
        pIVar17 = *ppIVar9;
      } while ((pIVar17->Active != true) || ((pIVar17->Flags & 0x200) != 0));
      IVar3 = (pIVar7->Style).TouchExtraPadding;
      local_40.Max.x = IVar3.x;
      local_40.Max.y = IVar3.y;
      IVar3 = (pIVar17->WindowRectClipped).Min;
      IVar4 = (pIVar17->WindowRectClipped).Max;
      local_40.Min.x = IVar3.x - local_40.Max.x;
      local_40.Min.y = IVar3.y - local_40.Max.y;
      local_40.Max.x = IVar4.x + local_40.Max.x;
      local_40.Max.y = IVar4.y + local_40.Max.y;
      bVar8 = ImRect::Contains(&local_40,&pIVar6->MousePos);
    } while (!bVar8);
  }
  pIVar7->HoveredWindow = pIVar17;
  window = pIVar17->RootWindow;
LAB_00155fb6:
  pIVar7->HoveredRootWindow = window;
  potential_parent = GetFrontMostPopupModal();
  if ((potential_parent != (ImGuiWindow *)0x0) && (window != (ImGuiWindow *)0x0)) {
    bVar8 = IsWindowChildOf(window,potential_parent);
    if (!bVar8) {
      pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
      pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
      pIVar17 = (ImGuiWindow *)0x0;
    }
  }
  uVar5 = (pIVar7->IO).ConfigFlags;
  if ((uVar5 & 0x10) != 0) {
    pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar17 = (ImGuiWindow *)0x0;
  }
  uVar13 = 0xffffffffffffffff;
  uVar16 = 0;
  bVar10 = 0;
  do {
    iVar14 = (int)uVar13;
    if (uVar16 == 5) {
      if (iVar14 == -1) {
        bVar11 = 1;
      }
      else {
        bVar11 = (pIVar7->IO).MouseDownOwned[iVar14];
      }
      if (pIVar7->DragDropActive == true) {
        bVar15 = ((byte)pIVar7->DragDropSourceFlags & 0x10) >> 4;
      }
      else {
        bVar15 = 0;
      }
      if (bVar15 == 0 && (bVar11 & 1) == 0) {
        pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
        pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
        pIVar17 = (ImGuiWindow *)0x0;
      }
      if (pIVar7->WantCaptureMouseNextFrame == -1) {
        bVar8 = true;
        if ((bVar11 & (pIVar17 != (ImGuiWindow *)0x0 | bVar10)) == 0) {
          bVar8 = (pIVar7->OpenPopupStack).Size != 0;
        }
        (pIVar7->IO).WantCaptureMouse = bVar8;
      }
      else {
        (pIVar7->IO).WantCaptureMouse = pIVar7->WantCaptureMouseNextFrame != 0;
      }
      if (pIVar7->WantCaptureKeyboardNextFrame == -1) {
        bVar8 = pIVar7->ActiveId != 0 || potential_parent != (ImGuiWindow *)0x0;
      }
      else {
        bVar8 = pIVar7->WantCaptureKeyboardNextFrame != 0;
      }
      bVar12 = true;
      if ((pIVar7->IO).NavActive == false) {
        bVar12 = bVar8;
      }
      if ((uVar5 & 9) != 1) {
        bVar12 = bVar8;
      }
      (pIVar7->IO).WantCaptureKeyboard = bVar12;
      (pIVar7->IO).WantTextInput = pIVar7->WantTextInputNextFrame - 1U < 0xfffffffe;
      return;
    }
    if ((pIVar7->IO).MouseClicked[uVar16] == true) {
      bVar8 = true;
      if (pIVar17 == (ImGuiWindow *)0x0) {
        bVar8 = (pIVar7->OpenPopupStack).Size != 0;
      }
      (pIVar7->IO).MouseDownOwned[uVar16] = bVar8;
    }
    bVar8 = (pIVar7->IO).MouseDown[uVar16];
    if (bVar8 == true) {
      if (iVar14 != -1) {
        fVar2 = (pIVar7->IO).MouseClickedTime[iVar14];
        pfVar1 = (pIVar7->IO).MouseClickedTime + uVar16;
        if (fVar2 < *pfVar1 || fVar2 == *pfVar1) goto LAB_00156068;
      }
      uVar13 = uVar16 & 0xffffffff;
    }
LAB_00156068:
    bVar10 = bVar10 & 1 | bVar8;
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void ImGui::NewFrameUpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    g.HoveredWindow = (g.MovingWindow && !(g.MovingWindow->Flags & ImGuiWindowFlags_NoInputs)) ? g.MovingWindow : FindHoveredWindow();
    g.HoveredRootWindow = g.HoveredWindow ? g.HoveredWindow->RootWindow : NULL;

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetFrontMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredRootWindow = g.HoveredWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to imgui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to imgui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}